

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

void av1_txfm_rd_in_plane
               (MACROBLOCK *x,AV1_COMP *cpi,RD_STATS *rd_stats,int64_t ref_best_rd,
               int64_t current_rd,int plane,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               FAST_TX_SEARCH_MODE ftxs_mode,int skip_trellis)

{
  MB_MODE_INFO *pMVar1;
  AV1_COMP *local_c8;
  MACROBLOCK *local_c0;
  ENTROPY_CONTEXT local_b8 [32];
  ENTROPY_CONTEXT local_98 [32];
  undefined8 local_78;
  int64_t iStack_70;
  int64_t iStack_68;
  int64_t iStack_60;
  undefined1 local_58;
  undefined7 uStack_57;
  int64_t local_50;
  int64_t local_48;
  int aiStack_40 [2];
  FAST_TX_SEARCH_MODE local_38;
  int local_34;
  
  if ((((cpi->oxcf).txfm_cfg.enable_tx64 != false) ||
      ((0x61810UL >> ((ulong)tx_size & 0x3f) & 1) == 0)) && (current_rd <= ref_best_rd)) {
    memset(local_b8,0,0x88);
    local_38 = ftxs_mode;
    local_34 = skip_trellis;
    iStack_70 = 0;
    iStack_68 = 0;
    iStack_60 = 0;
    local_58 = 1;
    local_c8 = cpi;
    local_c0 = x;
    local_50 = current_rd;
    local_48 = ref_best_rd;
    av1_get_entropy_contexts(plane_bsize,(x->e_mbd).plane + plane,local_b8,local_98);
    av1_foreach_transformed_block_in_plane(&x->e_mbd,plane_bsize,plane,block_rd_txfm,&local_c8);
    pMVar1 = *(x->e_mbd).mi;
    if ((pMVar1->field_0xa7 & 0x80) == 0) {
      aiStack_40[1] = aiStack_40['\0' < pMVar1->ref_frame[0]];
    }
    if (aiStack_40[1] == 0) {
      *(ulong *)&rd_stats->skip_txfm = CONCAT71(uStack_57,local_58);
      rd_stats->rdcost = iStack_68;
      rd_stats->sse = iStack_60;
      rd_stats->rate = (undefined4)local_78;
      rd_stats->zero_rate = local_78._4_4_;
      rd_stats->dist = iStack_70;
      return;
    }
  }
  rd_stats->rate = 0x7fffffff;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0x7fffffffffffffff;
  rd_stats->rdcost = 0x7fffffffffffffff;
  rd_stats->sse = 0x7fffffffffffffff;
  rd_stats->skip_txfm = '\0';
  return;
}

Assistant:

void av1_txfm_rd_in_plane(MACROBLOCK *x, const AV1_COMP *cpi,
                          RD_STATS *rd_stats, int64_t ref_best_rd,
                          int64_t current_rd, int plane, BLOCK_SIZE plane_bsize,
                          TX_SIZE tx_size, FAST_TX_SEARCH_MODE ftxs_mode,
                          int skip_trellis) {
  assert(IMPLIES(plane == 0, x->e_mbd.mi[0]->tx_size == tx_size));

  if (!cpi->oxcf.txfm_cfg.enable_tx64 &&
      txsize_sqr_up_map[tx_size] == TX_64X64) {
    av1_invalid_rd_stats(rd_stats);
    return;
  }

  if (current_rd > ref_best_rd) {
    av1_invalid_rd_stats(rd_stats);
    return;
  }

  MACROBLOCKD *const xd = &x->e_mbd;
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  struct rdcost_block_args args;
  av1_zero(args);
  args.x = x;
  args.cpi = cpi;
  args.best_rd = ref_best_rd;
  args.current_rd = current_rd;
  args.ftxs_mode = ftxs_mode;
  args.skip_trellis = skip_trellis;
  av1_init_rd_stats(&args.rd_stats);

  av1_get_entropy_contexts(plane_bsize, pd, args.t_above, args.t_left);
  av1_foreach_transformed_block_in_plane(xd, plane_bsize, plane, block_rd_txfm,
                                         &args);

  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int is_inter = is_inter_block(mbmi);
  const int invalid_rd = is_inter ? args.incomplete_exit : args.exit_early;

  if (invalid_rd) {
    av1_invalid_rd_stats(rd_stats);
  } else {
    *rd_stats = args.rd_stats;
  }
}